

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryNode
          (AssbinImporter *this,IOStream *stream,aiNode **onode,aiNode *parent)

{
  aiMetadataType aVar1;
  aiNode **ppaVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  ai_uint32 aVar6;
  DeadlyImportError *this_00;
  aiNode *paVar7;
  pointer paVar8;
  uint *puVar9;
  aiNode **ppaVar10;
  aiMetadata *paVar11;
  double dVar12;
  ulong uVar13;
  float fVar14;
  aiVector3D aVar15;
  aiString *local_8d0;
  void *data;
  uint local_4c4;
  uint local_4c0;
  uint i_2;
  uint i_1;
  uint i;
  uint nb_metadata;
  uint numMeshes;
  uint numChildren;
  float fStack_4a4;
  float fStack_4a0;
  float local_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float local_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  float local_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  aiString local_46c;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> local_68;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  allocator local_49;
  string local_48;
  aiNode *local_28;
  aiNode *parent_local;
  aiNode **onode_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_28 = parent;
  parent_local = (aiNode *)onode;
  onode_local = (aiNode **)stream;
  stream_local = (IOStream *)this;
  uVar5 = Read<unsigned_int>(stream);
  if (uVar5 != 0x123c) {
    node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl._3_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"Magic chunk identifiers are wrong!",&local_49)
    ;
    DeadlyImportError::DeadlyImportError(this_00,&local_48);
    node._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
    super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl._3_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  Read<unsigned_int>((IOStream *)onode_local);
  paVar7 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar7);
  std::unique_ptr<aiNode,std::default_delete<aiNode>>::unique_ptr<std::default_delete<aiNode>,void>
            ((unique_ptr<aiNode,std::default_delete<aiNode>> *)&local_68,paVar7);
  Read<aiString>(&local_46c,(IOStream *)onode_local);
  paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
  aiString::operator=(&paVar8->mName,&local_46c);
  Read<aiMatrix4x4t<float>>((aiMatrix4x4 *)&numMeshes,(IOStream *)onode_local);
  paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
  (paVar8->mTransformation).d1 = local_47c;
  (paVar8->mTransformation).d2 = fStack_478;
  (paVar8->mTransformation).d3 = fStack_474;
  (paVar8->mTransformation).d4 = fStack_470;
  (paVar8->mTransformation).c1 = local_48c;
  (paVar8->mTransformation).c2 = fStack_488;
  (paVar8->mTransformation).c3 = fStack_484;
  (paVar8->mTransformation).c4 = fStack_480;
  (paVar8->mTransformation).b1 = local_49c;
  (paVar8->mTransformation).b2 = fStack_498;
  (paVar8->mTransformation).b3 = fStack_494;
  (paVar8->mTransformation).b4 = fStack_490;
  (paVar8->mTransformation).a1 = (float)numMeshes;
  (paVar8->mTransformation).a2 = (float)numChildren;
  (paVar8->mTransformation).a3 = fStack_4a4;
  (paVar8->mTransformation).a4 = fStack_4a0;
  nb_metadata = Read<unsigned_int>((IOStream *)onode_local);
  i = Read<unsigned_int>((IOStream *)onode_local);
  i_1 = Read<unsigned_int>((IOStream *)onode_local);
  paVar7 = local_28;
  if (local_28 != (aiNode *)0x0) {
    paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
    paVar8->mParent = paVar7;
  }
  if (i != 0) {
    puVar9 = (uint *)operator_new__((ulong)i << 2);
    paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
    paVar8->mMeshes = puVar9;
    for (i_2 = 0; i_2 < i; i_2 = i_2 + 1) {
      uVar5 = Read<unsigned_int>((IOStream *)onode_local);
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      paVar8->mMeshes[i_2] = uVar5;
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      paVar8->mNumMeshes = paVar8->mNumMeshes + 1;
    }
  }
  if (nb_metadata != 0) {
    ppaVar10 = (aiNode **)operator_new__((ulong)nb_metadata << 3);
    paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
    paVar8->mChildren = ppaVar10;
    for (local_4c0 = 0; ppaVar10 = onode_local, local_4c0 < nb_metadata; local_4c0 = local_4c0 + 1)
    {
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      ppaVar2 = paVar8->mChildren;
      uVar13 = (ulong)local_4c0;
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::get(&local_68);
      ReadBinaryNode(this,(IOStream *)ppaVar10,ppaVar2 + uVar13,paVar8);
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      paVar8->mNumChildren = paVar8->mNumChildren + 1;
    }
  }
  if (i_1 != 0) {
    paVar11 = aiMetadata::Alloc(i_1);
    paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
    paVar8->mMetaData = paVar11;
    for (local_4c4 = 0; local_4c4 < i_1; local_4c4 = local_4c4 + 1) {
      Read<aiString>((aiString *)&data,(IOStream *)onode_local);
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      aiString::operator=(paVar8->mMetaData->mKeys + local_4c4,(aiString *)&data);
      uVar4 = Read<unsigned_short>((IOStream *)onode_local);
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      paVar8->mMetaData->mValues[local_4c4].mType = (uint)uVar4;
      local_8d0 = (aiString *)0x0;
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      aVar1 = paVar8->mMetaData->mValues[local_4c4].mType;
      if (aVar1 == AI_BOOL) {
        local_8d0 = (aiString *)operator_new(1);
        bVar3 = Read<bool>((IOStream *)onode_local);
        *(bool *)&local_8d0->length = bVar3;
      }
      else if (aVar1 == AI_INT32) {
        local_8d0 = (aiString *)operator_new(4);
        aVar6 = Read<int>((IOStream *)onode_local);
        local_8d0->length = aVar6;
      }
      else if (aVar1 == AI_UINT64) {
        local_8d0 = (aiString *)operator_new(8);
        dVar12 = (double)Read<unsigned_long>((IOStream *)onode_local);
        *(double *)local_8d0 = dVar12;
      }
      else if (aVar1 == AI_FLOAT) {
        local_8d0 = (aiString *)operator_new(4);
        fVar14 = Read<float>((IOStream *)onode_local);
        local_8d0->length = (ai_uint32)fVar14;
      }
      else if (aVar1 == AI_DOUBLE) {
        local_8d0 = (aiString *)operator_new(8);
        dVar12 = Read<double>((IOStream *)onode_local);
        *(double *)local_8d0 = dVar12;
      }
      else if (aVar1 == AI_AISTRING) {
        local_8d0 = (aiString *)operator_new(0x404);
        Read<aiString>(local_8d0,(IOStream *)onode_local);
      }
      else if (aVar1 == AI_AIVECTOR3D) {
        local_8d0 = (aiString *)operator_new(0xc);
        aVar15 = Read<aiVector3t<float>>((IOStream *)onode_local);
        *(double *)local_8d0 = aVar15._0_8_;
        *(float *)(local_8d0->data + 4) = aVar15.z;
      }
      paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_68);
      paVar8->mMetaData->mValues[local_4c4].mData = local_8d0;
    }
  }
  paVar8 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release(&local_68);
  *(pointer *)&parent_local->mName = paVar8;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&local_68);
  return;
}

Assistant:

void AssbinImporter::ReadBinaryNode( IOStream * stream, aiNode** onode, aiNode* parent ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AINODE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    std::unique_ptr<aiNode> node(new aiNode());

    node->mName = Read<aiString>(stream);
    node->mTransformation = Read<aiMatrix4x4>(stream);
    unsigned numChildren = Read<unsigned int>(stream);
    unsigned numMeshes = Read<unsigned int>(stream);
	unsigned int nb_metadata = Read<unsigned int>(stream);

    if(parent) {
        node->mParent = parent;
    }

    if (numMeshes)
    {
        node->mMeshes = new unsigned int[numMeshes];
        for (unsigned int i = 0; i < numMeshes; ++i) {
            node->mMeshes[i] = Read<unsigned int>(stream);
            node->mNumMeshes++;
        }
    }

    if (numChildren) {
        node->mChildren = new aiNode*[numChildren];
        for (unsigned int i = 0; i < numChildren; ++i) {
            ReadBinaryNode( stream, &node->mChildren[i], node.get() );
            node->mNumChildren++;
        }
    }

    if ( nb_metadata > 0 ) {
        node->mMetaData = aiMetadata::Alloc(nb_metadata);
        for (unsigned int i = 0; i < nb_metadata; ++i) {
            node->mMetaData->mKeys[i] = Read<aiString>(stream);
            node->mMetaData->mValues[i].mType = (aiMetadataType) Read<uint16_t>(stream);
            void* data = nullptr;

            switch (node->mMetaData->mValues[i].mType) {
                case AI_BOOL:
                    data = new bool(Read<bool>(stream));
                    break;
                case AI_INT32:
                    data = new int32_t(Read<int32_t>(stream));
                    break;
                case AI_UINT64:
                    data = new uint64_t(Read<uint64_t>(stream));
                    break;
                case AI_FLOAT:
                    data = new float(Read<float>(stream));
                    break;
                case AI_DOUBLE:
                    data = new double(Read<double>(stream));
                    break;
                case AI_AISTRING:
                    data = new aiString(Read<aiString>(stream));
                    break;
                case AI_AIVECTOR3D:
                    data = new aiVector3D(Read<aiVector3D>(stream));
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }

			node->mMetaData->mValues[i].mData = data;
		}
	}
    *onode = node.release();
}